

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Action.cpp
# Opt level: O0

Close * __thiscall Close::toString_abi_cxx11_(Close *this)

{
  ActionStatus AVar1;
  BaseAction *in_RSI;
  undefined1 local_b0 [80];
  __cxx11 local_60 [32];
  string local_40 [39];
  undefined1 local_19;
  Close *this_local;
  string *msg;
  
  local_19 = 0;
  this_local = this;
  std::__cxx11::to_string(local_60,*(int *)&in_RSI->field_0x2c);
  std::operator+((char *)local_40,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"close ");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                 (char *)local_40);
  std::__cxx11::string::~string(local_40);
  std::__cxx11::string::~string((string *)local_60);
  AVar1 = BaseAction::getStatus(in_RSI);
  if (AVar1 == COMPLETED) {
    std::__cxx11::string::append((char *)this);
  }
  else {
    AVar1 = BaseAction::getStatus(in_RSI);
    if (AVar1 == ERROR) {
      BaseAction::getErrorMsg_abi_cxx11_((BaseAction *)local_b0);
      std::operator+(local_b0 + 0x20,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"Error:");
      std::__cxx11::string::append((string *)this);
      std::__cxx11::string::~string((string *)(local_b0 + 0x20));
      std::__cxx11::string::~string((string *)local_b0);
    }
    else {
      std::__cxx11::string::append((char *)this);
    }
  }
  return this;
}

Assistant:

std::string Close::toString() const
{
    std::string msg("close " + std::to_string(tableId) + " ");
    if(getStatus() == ActionStatus::COMPLETED)
    {
        msg.append("Completed");
    }
    else  if(getStatus() == ActionStatus::ERROR)
    {
        msg.append("Error:" + getErrorMsg());
    }
    else msg.append("Pending");
    return msg;
}